

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O0

int demo_edit_proc(DEMO_MENU *item,int msg,int extra)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  uint in_EDX;
  int in_ESI;
  int iVar8;
  int iVar9;
  long in_RDI;
  undefined8 uVar10;
  int iVar12;
  undefined4 uVar11;
  int c;
  int l;
  int x;
  int h;
  int w;
  ALLEGRO_COLOR col;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  ALLEGRO_FONT *local_28;
  
  if (in_ESI == 1) {
    if ((*(uint *)(in_RDI + 0x10) & 2) == 0) {
      local_28 = (ALLEGRO_FONT *)al_map_rgb(0xff,0xff);
    }
    else {
      local_28 = (ALLEGRO_FONT *)al_map_rgb(0xff,0xff,0);
    }
    iVar6 = _iVar12;
    iVar2 = demo_edit_proc((DEMO_MENU *)CONCAT44(in_ESI,in_EDX),(int)((ulong)_iVar12 >> 0x20),
                           (int)_iVar12);
    iVar3 = al_get_font_line_height(demo_data[1].dat);
    iVar8 = screen_width - iVar2;
    iVar9 = in_EDX - 2;
    iVar4 = screen_width + iVar2;
    iVar5 = in_EDX + 2;
    uVar10 = al_map_rgb(0,0);
    uVar11 = 0;
    al_draw_filled_rectangle
              ((float)(iVar8 / 2 + -2),(float)iVar9,(float)(iVar4 / 2 + 2),(float)(iVar5 + iVar3),
               uVar10,(undefined8)_iVar12);
    al_draw_rectangle((float)((screen_width - iVar2) / 2 + -2),(float)(int)(in_EDX - 2),
                      (float)((screen_width + iVar2) / 2 + 2),(float)(int)(in_EDX + 2 + iVar3),
                      local_28,(undefined8)iVar6,0x3f800000);
    shadow_textprintf(local_28,iVar6,(int)demo_data[1].dat,(ulong)(uint)(screen_width / 2),
                      (int)(ulong)in_EDX,(char *)0x2,*(undefined8 *)(in_RDI + 8));
    iVar5 = screen_width;
    if ((*(uint *)(in_RDI + 0x10) & 2) != 0) {
      iVar2 = al_get_text_width(demo_data[1].dat,*(undefined8 *)(in_RDI + 8));
      iVar5 = (iVar5 + iVar2) / 2 + 2;
      fVar1 = (float)iVar5 + 0.5;
      al_draw_line(CONCAT44(uVar11,fVar1),CONCAT44(0x3fe00000,(float)(int)(in_EDX + 2)),fVar1,
                   (float)(int)((in_EDX - 2) + iVar3),local_28,(undefined8)iVar6,0x3f800000);
      fVar1 = (float)iVar5 + 1.5;
      al_draw_line(CONCAT44(uVar11,fVar1),CONCAT44(0x3ff80000,(float)(int)(in_EDX + 2)),fVar1,
                   (float)(int)((in_EDX - 2) + iVar3),local_28,(undefined8)iVar6,0x3f800000);
    }
  }
  else if (in_ESI == 2) {
    if (in_EDX == 8) {
      sVar7 = strlen(*(char **)(in_RDI + 8));
      if (0 < (int)sVar7) {
        *(undefined1 *)(*(long *)(in_RDI + 8) + (long)((int)sVar7 + -1)) = 0;
        if (*(long *)(in_RDI + 0x20) != 0) {
          (**(code **)(in_RDI + 0x20))(in_RDI);
        }
        play_sound_id(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                      in_stack_ffffffffffffff58,0);
      }
    }
    else {
      sVar7 = strlen(*(char **)(in_RDI + 8));
      if ((((int)sVar7 < *(int *)(in_RDI + 0x14)) && (0x1f < (in_EDX & 0xff))) &&
         ((in_EDX & 0xff) < 0x7f)) {
        *(char *)(*(long *)(in_RDI + 8) + (long)(int)sVar7) = (char)in_EDX;
        if (*(long *)(in_RDI + 0x20) != 0) {
          (**(code **)(in_RDI + 0x20))(in_RDI);
        }
        play_sound_id(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                      in_stack_ffffffffffffff58,0);
      }
    }
  }
  else {
    if (in_ESI == 4) {
      iVar6 = al_get_text_width(demo_data[1].dat,*(undefined8 *)(in_RDI + 8));
      iVar5 = *(int *)(in_RDI + 0x14);
      iVar2 = al_get_text_width(demo_data[1].dat," ");
      if (iVar5 * iVar2 < iVar6) {
        iVar5 = al_get_text_width(demo_data[1].dat,*(undefined8 *)(in_RDI + 8));
        return iVar5;
      }
      iVar5 = *(int *)(in_RDI + 0x14);
      iVar6 = al_get_text_width(demo_data[1].dat," ");
      return iVar5 * iVar6;
    }
    if (in_ESI == 5) {
      iVar5 = al_get_font_line_height(demo_data[1].dat);
      return iVar5 + 8;
    }
  }
  return 1000;
}

Assistant:

int demo_edit_proc(DEMO_MENU * item, int msg, int extra)
{
   ALLEGRO_COLOR col;
   int w, h, x;
   int l, c;

   if (msg == DEMO_MENU_MSG_DRAW) {
      if (item->flags & DEMO_MENU_SELECTED) {
         col = al_map_rgb(255, 255, 0);
      } else {
         col = al_map_rgb(255, 255, 255);
      }

      w = demo_edit_proc(item, DEMO_MENU_MSG_WIDTH, 0);
      h = al_get_font_line_height(demo_font);

      al_draw_filled_rectangle((screen_width - w) / 2 - 2, extra - 2,
               (screen_width + w) / 2 + 2, extra + h + 2, al_map_rgb(0, 0, 0));
      al_draw_rectangle((screen_width - w) / 2 - 2, extra - 2,
           (screen_width + w) / 2 + 2, extra + h + 2, col, 1);
      shadow_textprintf(demo_font, screen_width / 2,
                      extra, col, 2, item->name);
      if (item->flags & DEMO_MENU_SELECTED) {
         x = (screen_width + al_get_text_width(demo_font, item->name)) / 2 + 2;
         al_draw_line(x + 0.5, extra + 2, x + 0.5, extra + h - 2, col, 1);
         al_draw_line(x + 1.5, extra + 2, x + 1.5, extra + h - 2, col, 1);
      }
   } else if (msg == DEMO_MENU_MSG_CHAR) {
      switch (extra) {
         case 8:
            l = strlen(item->name);
            if (l > 0) {
               item->name[l - 1] = 0;

               if (item->on_activate) {
                  item->on_activate(item);
               }

               play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);
            }
            break;

         default:
            l = strlen(item->name);
            c = extra & 0xff;
            if (l < item->extra && c >= 0x20 && c < 0x7f) {
               item->name[l] = c;

               if (item->on_activate) {
                  item->on_activate(item);
               }

               play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);
            }
            break;
      }
   } else if (msg == DEMO_MENU_MSG_WIDTH) {
      return MAX(al_get_text_width(demo_font, item->name),
                 item->extra * al_get_text_width(demo_font, " "));
   } else if (msg == DEMO_MENU_MSG_HEIGHT) {
      return al_get_font_line_height(demo_font) + 8;
   }

   return DEMO_MENU_CONTINUE;
}